

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::TriageCompareLineSin2Distance<double>
              (Vector3<double> *x,Vector3<double> *a0,Vector3<double> *a1,double r2,
              Vector3<double> *n,double n1,double n2)

{
  double dVar1;
  __type_conflict _Var2;
  double dVar3;
  double dVar4;
  int local_e4;
  double error;
  double diff;
  double xDn2_error;
  double c1;
  double xDn2;
  D local_88;
  double local_70;
  double xDn;
  double ax2;
  double n2sin2_r_error;
  double n2sin2_r;
  double T_ERR;
  double n2_local;
  double n1_local;
  Vector3<double> *n_local;
  double r2_local;
  Vector3<double> *a1_local;
  Vector3<double> *a0_local;
  Vector3<double> *x_local;
  
  n2sin2_r = 1.1102230246251565e-16;
  if (r2 < 2.0) {
    n2sin2_r_error = n2 * r2 * (1.0 - r2 * 0.25);
    ax2 = n2sin2_r_error * 6.661338147750939e-16;
    T_ERR = n2;
    n2_local = n1;
    n1_local = (double)n;
    n_local = (Vector3<double> *)r2;
    r2_local = (double)a1;
    a1_local = a0;
    a0_local = x;
    GetClosestVertex<double>((Vector3<double> *)&xDn2,x,a0,a1,&xDn);
    util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
              (&local_88,(BasicVector<Vector3,_double,_3UL> *)x,(D *)&xDn2);
    local_70 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                         ((BasicVector<Vector3,_double,_3UL> *)&local_88,(D *)n1_local);
    dVar1 = local_70 * local_70;
    _Var2 = std::sqrt<int>(3);
    dVar3 = (_Var2 * 2.0 + 3.5) * n2_local;
    _Var2 = std::sqrt<int>(3);
    dVar4 = sqrt(xDn);
    dVar4 = (dVar3 + _Var2 * 32.0 * 1.1102230246251565e-16) * 1.1102230246251565e-16 * dVar4;
    dVar3 = dVar1 - n2sin2_r_error;
    dVar1 = dVar1 * 4.440892098500626e-16 + (ABS(local_70) * 2.0 + dVar4) * dVar4 +
            n2sin2_r_error * 8.881784197001252e-16 + ax2;
    if (dVar3 <= dVar1) {
      local_e4 = 0;
      if (dVar3 < -dVar1) {
        local_e4 = -1;
      }
    }
    else {
      local_e4 = 1;
    }
    x_local._4_4_ = local_e4;
  }
  else {
    x_local._4_4_ = -1;
  }
  return x_local._4_4_;
}

Assistant:

int TriageCompareLineSin2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute sin^2(distance to edge) to get the best accuracy
  // when the distance limit is small (e.g., S2::kIntersectionError).
  T n2sin2_r = n2 * r2 * (1 - 0.25 * r2);
  T n2sin2_r_error = 6 * T_ERR * n2sin2_r;
  T ax2, xDn = (x - GetClosestVertex(x, a0, a1, &ax2)).DotProd(n);
  T xDn2 = xDn * xDn;
  const T c1 = (((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) *
                T_ERR * sqrt(ax2));
  T xDn2_error = 4 * T_ERR * xDn2 + (2 * fabs(xDn) + c1) * c1;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to with a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2sin2_r *= x.Norm2();
    n2sin2_r_error += 4 * T_ERR * n2sin2_r;
  } else {
    n2sin2_r_error += 8 * DBL_ERR * n2sin2_r;
  }
  T diff = xDn2 - n2sin2_r;
  T error = xDn2_error + n2sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}